

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  pointer pnVar10;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  pointer pnVar20;
  long in_FS_OFFSET;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined5 uStack_60;
  undefined3 uStack_5b;
  uint local_58;
  undefined4 uStack_54;
  int local_50;
  bool local_4c;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[n]) {
  case P_FIXED:
    ::soplex::infinity::__tls_init();
    local_38 = *(double *)(in_FS_OFFSET + -8);
    uStack_30 = 0;
    local_48 = 0xa00000000;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_5b = 0;
    local_58 = 0;
    uStack_54 = 0;
    local_50 = 0;
    local_4c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-local_38);
    pnVar20 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pnVar20[i].m_backend.data = local_78;
    *(undefined8 *)((long)&pnVar20[i].m_backend.data + 8) = uStack_70;
    puVar1 = (uint *)((long)&pnVar20[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_68;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_5b,uStack_60);
    *(ulong *)((long)&pnVar20[i].m_backend.data + 0x20) = CONCAT44(uStack_54,local_58);
    pnVar20[i].m_backend.exp = local_50;
    pnVar20[i].m_backend.neg = local_4c;
    pnVar20[i].m_backend.fpclass = (undefined4)local_48;
    pnVar20[i].m_backend.prec_elem = local_48._4_4_;
    ::soplex::infinity::__tls_init();
    uVar21 = (undefined4)local_38;
    uVar22 = local_38._4_4_;
    break;
  default:
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar20[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar20[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar20[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = pnVar20[n].m_backend.fpclass;
    uVar14 = pnVar20[n].m_backend.prec_elem;
    bVar2 = pnVar20[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar9 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar9;
    pnVar10[i].m_backend.prec_elem = uVar14;
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_0027856e;
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_48 = 0xa00000000;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_5b = 0;
    local_58 = 0;
    uStack_54 = 0;
    local_50 = 0;
    local_4c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-*(double *)(in_FS_OFFSET + -8));
    pnVar20 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pnVar20[i].m_backend.data = local_78;
    *(undefined8 *)((long)&pnVar20[i].m_backend.data + 8) = uStack_70;
    puVar1 = (uint *)((long)&pnVar20[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_68;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_5b,uStack_60);
    *(ulong *)((long)&pnVar20[i].m_backend.data + 0x20) = CONCAT44(uStack_54,local_58);
    pnVar20[i].m_backend.exp = local_50;
    pnVar20[i].m_backend.neg = local_4c;
    pnVar20[i].m_backend.fpclass = (undefined4)local_48;
    pnVar20[i].m_backend.prec_elem = local_48._4_4_;
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar20[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar20[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar20[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = pnVar20[n].m_backend.fpclass;
    uVar12 = pnVar20[n].m_backend.prec_elem;
    bVar2 = pnVar20[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar7 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar7;
    pnVar10[i].m_backend.prec_elem = uVar12;
    return;
  case P_ON_UPPER:
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar20[n].m_backend.data;
    local_58 = *(uint *)((long)&pnVar20[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 0x14);
    local_68 = *(undefined8 *)puVar1;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    uStack_60 = (undefined5)uVar15;
    uStack_5b = (undefined3)((ulong)uVar15 >> 0x28);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 4);
    local_78 = *(undefined8 *)puVar1;
    uStack_70 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar20[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = pnVar20[n].m_backend.fpclass;
    uVar11 = pnVar20[n].m_backend.prec_elem;
    bVar2 = pnVar20[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = local_78;
    *(undefined8 *)(puVar1 + 2) = uStack_70;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = local_68;
    *(undefined8 *)(puVar1 + 2) = uVar15;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = local_58;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar6 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar6;
    pnVar10[i].m_backend.prec_elem = uVar11;
    ::soplex::infinity::__tls_init();
    uVar21 = (int)*(undefined8 *)(in_FS_OFFSET + -8);
    uVar22 = (int)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    break;
  case P_FREE:
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar20[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar20[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar20[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = pnVar20[n].m_backend.fpclass;
    uVar13 = pnVar20[n].m_backend.prec_elem;
    bVar2 = pnVar20[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar8 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar8;
    pnVar10[i].m_backend.prec_elem = uVar13;
    pnVar20 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_0027856e:
    iVar3 = *(int *)&pnVar20[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar20[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 0x14);
    uVar16 = *(undefined8 *)puVar1;
    uVar17 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar20[n].m_backend.data + 4);
    uVar18 = *(undefined8 *)puVar1;
    uVar19 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar20[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15._0_4_ = pnVar20[n].m_backend.fpclass;
    uVar15._4_4_ = pnVar20[n].m_backend.prec_elem;
    bVar2 = pnVar20[n].m_backend.neg;
    *(int *)(pnVar10 + i) = iVar3;
    *(undefined8 *)((long)(pnVar10 + i) + 4) = uVar18;
    *(undefined8 *)((long)(pnVar10 + i) + 0xc) = uVar19;
    *(undefined8 *)((long)(pnVar10 + i) + 0x14) = uVar16;
    *(undefined8 *)((long)(pnVar10 + i) + 0x1c) = uVar17;
    *(uint *)((long)(pnVar10 + i) + 0x24) = uVar4;
    *(int *)((long)(pnVar10 + i) + 0x28) = iVar5;
    *(char *)((long)(pnVar10 + i) + 0x2c) = (iVar3 != 0 || (undefined4)uVar15 != 0) ^ bVar2;
    *(undefined8 *)((long)(pnVar10 + i) + 0x30) = uVar15;
    return;
  }
  uStack_54 = 0;
  local_48 = 0xa00000000;
  local_4c = false;
  local_50 = 0;
  local_58 = 0;
  uStack_5b = 0;
  uStack_60 = 0;
  local_68 = 0;
  uStack_70 = 0;
  local_78 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,(double)CONCAT44(uVar22,uVar21));
  pnVar20 = (this->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar20 + i) = local_78;
  *(undefined8 *)((long)(pnVar20 + i) + 8) = uStack_70;
  *(undefined8 *)((long)(pnVar20 + i) + 0x10) = local_68;
  *(ulong *)((long)(pnVar20 + i) + 0x18) = CONCAT35(uStack_5b,uStack_60);
  *(ulong *)((long)(pnVar20 + i) + 0x20) = CONCAT44(uStack_54,local_58);
  *(int *)((long)(pnVar20 + i) + 0x28) = local_50;
  *(bool *)((long)(pnVar20 + i) + 0x2c) = local_4c;
  *(undefined8 *)((long)(pnVar20 + i) + 0x30) = local_48;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}